

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O3

ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *
llvm::MemoryBuffer::getSTDIN(void)

{
  pointer *__ptr;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>> *in_RDI;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>_2
  local_48;
  byte local_38;
  Twine local_30;
  
  sys::ChangeStdinToBinary();
  Twine::Twine(&local_30,"<stdin>");
  getMemoryBufferForStream
            ((ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
              *)&local_48.TStorage,0,&local_30);
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
  moveConstruct<std::unique_ptr<llvm::WritableMemoryBuffer,std::default_delete<llvm::WritableMemoryBuffer>>>
            (in_RDI,(ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                     *)&local_48.TStorage);
  if (((local_38 & 1) == 0) &&
     ((AlignedCharArray<8UL,_8UL>)local_48.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer !=
      (AlignedCharArray<8UL,_8UL>)0x0)) {
    (**(code **)(*(long *)local_48.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))();
  }
  return (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_> *)
         in_RDI;
}

Assistant:

ErrorOr<std::unique_ptr<MemoryBuffer>> MemoryBuffer::getSTDIN() {
  // Read in all of the data from stdin, we cannot mmap stdin.
  //
  // FIXME: That isn't necessarily true, we should try to mmap stdin and
  // fallback if it fails.
  sys::ChangeStdinToBinary();

  return getMemoryBufferForStream(0, "<stdin>");
}